

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

string * __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::getInputPrimitiveTypeQualifier_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderInvalidArrayedInputVariablesTest *this,
          GLenum gs_input_primitive_type)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((((gs_input_primitive_type == 0xc) || (gs_input_primitive_type == 1)) ||
      (gs_input_primitive_type == 4)) ||
     ((gs_input_primitive_type == 10 || (gs_input_primitive_type == 0)))) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderInvalidArrayedInputVariablesTest::getInputPrimitiveTypeQualifier(
	glw::GLenum gs_input_primitive_type) const
{
	std::string result;

	switch (gs_input_primitive_type)
	{
	case GL_POINTS:
		result = "points";
		break;
	case GL_LINES:
		result = "lines";
		break;
	case GL_LINES_ADJACENCY:
		result = "lines_adjacency";
		break;
	case GL_TRIANGLES:
		result = "triangles";
		break;
	case GL_TRIANGLES_ADJACENCY:
		result = "triangles_adjacency";
		break;

	default:
	{
		DE_ASSERT(0);
	}
	} /* switch (gs_input_primitive_type) */

	return result;
}